

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FeatureDescription *pFVar4;
  size_t sVar5;
  long lVar6;
  string *psVar7;
  uint local_30;
  int cached_size;
  uint i_2;
  uint count_2;
  uint i_1;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  ModelDescription *this_local;
  
  uVar2 = input_size(this);
  _i = (size_t)uVar2;
  for (i_1 = 0; i_1 < uVar2; i_1 = i_1 + 1) {
    pFVar4 = input(this,i_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pFVar4);
    _i = sVar5 + _i;
  }
  uVar2 = output_size(this);
  _i = uVar2 + _i;
  for (i_2 = 0; i_2 < uVar2; i_2 = i_2 + 1) {
    pFVar4 = output(this,i_2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pFVar4);
    _i = sVar5 + _i;
  }
  uVar2 = traininginput_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
    pFVar4 = traininginput(this,local_30);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureDescription>(pFVar4);
    _i = sVar5 + _i;
  }
  predictedfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = predictedfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  predictedprobabilitiesname_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = predictedprobabilitiesname_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  bVar1 = has_metadata(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Metadata>(this->metadata_);
    _i = sVar5 + 2 + _i;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  {
    unsigned int count = this->input_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  {
    unsigned int count = this->output_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->output(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  {
    unsigned int count = this->traininginput_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->traininginput(i));
    }
  }

  // string predictedFeatureName = 11;
  if (this->predictedfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (this->predictedprobabilitiesname().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedprobabilitiesname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->has_metadata()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->metadata_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}